

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O3

int compareSymbols(void *a,void *b)

{
  char *__s;
  char *__s_00;
  int iVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  size_t __n;
  size_t __n_00;
  SortedSymbol *sym2;
  SortedSymbol *sym1;
  
  if (*(ushort *)((long)a + 0xc) != *(ushort *)((long)b + 0xc)) {
    return -(uint)(*(ushort *)((long)a + 0xc) < *(ushort *)((long)b + 0xc)) | 1;
  }
  __s = (char *)**a;
  __s_00 = (char *)**b;
  pcVar3 = strchr(__s,0x2e);
  pcVar4 = strchr(__s_00,0x2e);
  if ((pcVar4 == (char *)0x0) == (pcVar3 != (char *)0x0)) {
    __n = strlen(__s);
    __n_00 = strlen(__s_00);
    iVar1 = strncmp(__s,__s_00,__n);
    if (((iVar1 != 0) || (uVar2 = 0xffffffff, __s_00[__n] != '.')) &&
       ((iVar1 = strncmp(__s_00,__s,__n_00), iVar1 != 0 || (uVar2 = 1, __s[__n_00] != '.')))) {
      uVar2 = -(uint)(pcVar3 != (char *)0x0) | 1;
    }
  }
  else {
    uVar2 = 0xffffffff;
    if (*(uint *)((long)b + 8) <= *(uint *)((long)a + 8)) {
      uVar2 = (uint)(*(uint *)((long)b + 8) < *(uint *)((long)a + 8));
    }
  }
  return uVar2;
}

Assistant:

static int compareSymbols(void const *a, void const *b)
{
	struct SortedSymbol const *sym1 = (struct SortedSymbol const *)a;
	struct SortedSymbol const *sym2 = (struct SortedSymbol const *)b;

	if (sym1->addr != sym2->addr)
		return sym1->addr < sym2->addr ? -1 : 1;

	char const *sym1_name = sym1->sym->name;
	char const *sym2_name = sym2->sym->name;
	bool sym1_local = strchr(sym1_name, '.');
	bool sym2_local = strchr(sym2_name, '.');

	if (sym1_local != sym2_local) {
		size_t sym1_len = strlen(sym1_name);
		size_t sym2_len = strlen(sym2_name);

		// Sort parent labels before their child local labels
		if (!strncmp(sym1_name, sym2_name, sym1_len) && sym2_name[sym1_len] == '.')
			return -1;
		if (!strncmp(sym2_name, sym1_name, sym2_len) && sym1_name[sym2_len] == '.')
			return 1;
		// Sort local labels before unrelated global labels
		return sym1_local ? -1 : 1;
	}

	return sym1->idx < sym2->idx ? -1 : sym1->idx > sym2->idx ? 1 : 0;
}